

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

int mbedtls_net_accept(mbedtls_net_context *bind_ctx,mbedtls_net_context *client_ctx,void *client_ip
                      ,size_t buf_size,size_t *ip_len)

{
  int iVar1;
  ssize_t sVar2;
  sockaddr_in6 *addr6;
  sockaddr_in *addr4;
  undefined1 local_150 [4];
  int one;
  sockaddr_storage local_addr;
  socklen_t local_c8;
  socklen_t sStack_c4;
  char buf [1];
  socklen_t type_len;
  socklen_t n;
  sockaddr_storage client_addr;
  int type;
  int ret;
  size_t *ip_len_local;
  size_t buf_size_local;
  void *client_ip_local;
  mbedtls_net_context *client_ctx_local;
  mbedtls_net_context *bind_ctx_local;
  
  sStack_c4 = 0x80;
  local_c8 = 4;
  iVar1 = getsockopt(bind_ctx->fd,1,3,&client_addr.__ss_align,&local_c8);
  if ((iVar1 != 0) || (((int)client_addr.__ss_align != 1 && ((int)client_addr.__ss_align != 2)))) {
    return -0x4a;
  }
  if ((int)client_addr.__ss_align == 1) {
    client_addr.__ss_align._4_4_ =
         accept(bind_ctx->fd,(sockaddr *)&type_len,&stack0xffffffffffffff3c);
    client_ctx->fd = client_addr.__ss_align._4_4_;
  }
  else {
    memset((void *)((long)&local_addr.__ss_align + 7),0,1);
    sVar2 = recvfrom(bind_ctx->fd,(void *)((long)&local_addr.__ss_align + 7),1,2,
                     (sockaddr *)&type_len,&stack0xffffffffffffff3c);
    client_addr.__ss_align._4_4_ = (int)sVar2;
  }
  if (client_addr.__ss_align._4_4_ < 0) {
    iVar1 = net_would_block(bind_ctx);
    if (iVar1 != 0) {
      return -0x6900;
    }
    return -0x4a;
  }
  if ((int)client_addr.__ss_align == 1) {
LAB_0014d720:
    if (client_ip != (void *)0x0) {
      if ((short)type_len == 2) {
        *ip_len = 4;
        if (buf_size < *ip_len) {
          return -0x43;
        }
        memcpy(client_ip,&n,*ip_len);
      }
      else {
        *ip_len = 0x10;
        if (buf_size < *ip_len) {
          return -0x43;
        }
        memcpy(client_ip,&client_addr,*ip_len);
      }
    }
    return 0;
  }
  addr4._4_4_ = 1;
  iVar1 = connect(bind_ctx->fd,(sockaddr *)&type_len,sStack_c4);
  if (iVar1 != 0) {
    return -0x4a;
  }
  client_ctx->fd = bind_ctx->fd;
  bind_ctx->fd = -1;
  sStack_c4 = 0x80;
  iVar1 = getsockname(client_ctx->fd,(sockaddr *)local_150,&stack0xffffffffffffff3c);
  if (iVar1 == 0) {
    iVar1 = socket((uint)(ushort)local_150._0_2_,2,0x11);
    bind_ctx->fd = iVar1;
    if ((-1 < iVar1) &&
       (iVar1 = setsockopt(bind_ctx->fd,1,2,(void *)((long)&addr4 + 4),4), iVar1 == 0)) {
      iVar1 = bind(bind_ctx->fd,(sockaddr *)local_150,sStack_c4);
      if (iVar1 != 0) {
        return -0x46;
      }
      goto LAB_0014d720;
    }
  }
  return -0x42;
}

Assistant:

int mbedtls_net_accept( mbedtls_net_context *bind_ctx,
                        mbedtls_net_context *client_ctx,
                        void *client_ip, size_t buf_size, size_t *ip_len )
{
    int ret;
    int type;

    struct sockaddr_storage client_addr;

#if defined(__socklen_t_defined) || defined(_SOCKLEN_T) ||  \
    defined(_SOCKLEN_T_DECLARED) || defined(__DEFINED_socklen_t)
    socklen_t n = (socklen_t) sizeof( client_addr );
    socklen_t type_len = (socklen_t) sizeof( type );
#else
    int n = (int) sizeof( client_addr );
    int type_len = (int) sizeof( type );
#endif

    /* Is this a TCP or UDP socket? */
    if( getsockopt( bind_ctx->fd, SOL_SOCKET, SO_TYPE,
                    (void *) &type, &type_len ) != 0 ||
        ( type != SOCK_STREAM && type != SOCK_DGRAM ) )
    {
        return( MBEDTLS_ERR_NET_ACCEPT_FAILED );
    }

    if( type == SOCK_STREAM )
    {
        /* TCP: actual accept() */
        ret = client_ctx->fd = (int) accept( bind_ctx->fd,
                                         (struct sockaddr *) &client_addr, &n );
    }
    else
    {
        /* UDP: wait for a message, but keep it in the queue */
        char buf[1] = { 0 };

        ret = (int) recvfrom( bind_ctx->fd, buf, sizeof( buf ), MSG_PEEK,
                        (struct sockaddr *) &client_addr, &n );

#if defined(_WIN32)
        if( ret == SOCKET_ERROR &&
            WSAGetLastError() == WSAEMSGSIZE )
        {
            /* We know buf is too small, thanks, just peeking here */
            ret = 0;
        }
#endif
    }

    if( ret < 0 )
    {
        if( net_would_block( bind_ctx ) != 0 )
            return( MBEDTLS_ERR_SSL_WANT_READ );

        return( MBEDTLS_ERR_NET_ACCEPT_FAILED );
    }

    /* UDP: hijack the listening socket to communicate with the client,
     * then bind a new socket to accept new connections */
    if( type != SOCK_STREAM )
    {
        struct sockaddr_storage local_addr;
        int one = 1;

        if( connect( bind_ctx->fd, (struct sockaddr *) &client_addr, n ) != 0 )
            return( MBEDTLS_ERR_NET_ACCEPT_FAILED );

        client_ctx->fd = bind_ctx->fd;
        bind_ctx->fd   = -1; /* In case we exit early */

        n = sizeof( struct sockaddr_storage );
        if( getsockname( client_ctx->fd,
                         (struct sockaddr *) &local_addr, &n ) != 0 ||
            ( bind_ctx->fd = (int) socket( local_addr.ss_family,
                                           SOCK_DGRAM, IPPROTO_UDP ) ) < 0 ||
            setsockopt( bind_ctx->fd, SOL_SOCKET, SO_REUSEADDR,
                        (const char *) &one, sizeof( one ) ) != 0 )
        {
            return( MBEDTLS_ERR_NET_SOCKET_FAILED );
        }

        if( bind( bind_ctx->fd, (struct sockaddr *) &local_addr, n ) != 0 )
        {
            return( MBEDTLS_ERR_NET_BIND_FAILED );
        }
    }

    if( client_ip != NULL )
    {
        if( client_addr.ss_family == AF_INET )
        {
            struct sockaddr_in *addr4 = (struct sockaddr_in *) &client_addr;
            *ip_len = sizeof( addr4->sin_addr.s_addr );

            if( buf_size < *ip_len )
                return( MBEDTLS_ERR_NET_BUFFER_TOO_SMALL );

            memcpy( client_ip, &addr4->sin_addr.s_addr, *ip_len );
        }
        else
        {
            struct sockaddr_in6 *addr6 = (struct sockaddr_in6 *) &client_addr;
            *ip_len = sizeof( addr6->sin6_addr.s6_addr );

            if( buf_size < *ip_len )
                return( MBEDTLS_ERR_NET_BUFFER_TOO_SMALL );

            memcpy( client_ip, &addr6->sin6_addr.s6_addr, *ip_len);
        }
    }

    return( 0 );
}